

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O2

char * customgetcwd(char *buf,size_t size)

{
  int iVar1;
  char *pcVar2;
  
  if (customgetcwd::real_getcwd == '\0') {
    iVar1 = __cxa_guard_acquire(&customgetcwd::real_getcwd);
    if (iVar1 != 0) {
      customgetcwd::real_getcwd = (getcwdFunction *)dlsym(0xffffffffffffffff,"getcwd");
      __cxa_guard_release(&customgetcwd::real_getcwd);
    }
  }
  if (buf == (char *)0x0) {
    if (size == 0) {
      size = 0x1000;
    }
    buf = (char *)xxmalloc(size);
  }
  pcVar2 = (*customgetcwd::real_getcwd)(buf,size);
  return pcVar2;
}

Assistant:

char * MYCDECL CUSTOM_GETCWD(char * buf, size_t size)
{
  static getcwdFunction * real_getcwd
    = reinterpret_cast<getcwdFunction *>
    (reinterpret_cast<uintptr_t>(dlsym (RTLD_NEXT, "getcwd")));

  if (!buf) {
    if (size == 0) {
      size = PATH_MAX;
    }
    buf = (char *) xxmalloc(size);
  }
  return (real_getcwd)(buf, size);
}